

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

Light * rw::Light::streamRead(Stream *stream)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  float fVar3;
  float32 a;
  Light *light;
  undefined4 local_38;
  Error _e;
  LightChunkData buf;
  uint32 version;
  Stream *stream_local;
  
  unique0x10000184 = stream;
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)&buf.minusCosAngle);
  if (bVar1) {
    Stream::read32(stack0xffffffffffffffe8,&_e,0x18);
    stream_local = (Stream *)create((uint)buf.blue >> 0x10);
    if ((Light *)stream_local == (Light *)0x0) {
      stream_local = (Stream *)0x0;
    }
    else {
      ((Light *)stream_local)->radius = (float32)_e.plugin;
      setColor((Light *)stream_local,(float32)_e.code,buf.radius,buf.red);
      if ((uint)buf.minusCosAngle < 0x30300) {
        fVar3 = sqrtf((float)buf.green * (float)buf.green + 1.0);
        ((Light *)stream_local)->minusCosAngle = (float32)(-1.0 / fVar3);
      }
      else {
        ((Light *)stream_local)->minusCosAngle = buf.green;
      }
      (((Light *)stream_local)->object).object.flags = buf.blue._0_1_;
      bVar1 = PluginList::streamRead((PluginList *)&s_plglist,stack0xffffffffffffffe8,stream_local);
      if (!bVar1) {
        destroy((Light *)stream_local);
        stream_local = (Stream *)0x0;
      }
    }
  }
  else {
    light._4_4_ = 0x12;
    local_38 = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/light.cpp",0x71);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000004,"STRUCT");
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)((long)&light + 4));
    stream_local = (Stream *)0x0;
  }
  return (Light *)stream_local;
}

Assistant:

Light*
Light::streamRead(Stream *stream)
{
	uint32 version;
	LightChunkData buf;

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(LightChunkData));
	Light *light = Light::create(buf.type_flags>>16);
	if(light == nil)
		return nil;
	light->radius = buf.radius;
	light->setColor(buf.red, buf.green, buf.blue);
	float32 a = buf.minusCosAngle;
	if(version >= 0x30300)
		light->minusCosAngle = a;
	else
		// tan -> -cos
		light->minusCosAngle = -1.0f/sqrtf(a*a+1.0f);
	light->object.object.flags = (uint8)buf.type_flags;
	if(s_plglist.streamRead(stream, light))
		return light;
	light->destroy();
	return nil;
}